

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::Equals,false,false,false,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  sel_t sVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  unsigned_long uVar16;
  
  if (count + 0x3f < 0x40) {
    lVar12 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar12 = 0;
    uVar13 = 0;
    uVar10 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar16 = 0xffffffffffffffff;
      }
      else {
        uVar16 = puVar1[uVar13];
      }
      uVar15 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar15 = count;
      }
      uVar8 = uVar10;
      if (uVar16 == 0xffffffffffffffff) {
        if (uVar10 < uVar15) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          uVar11 = uVar10 << 4 | 8;
          do {
            uVar8 = uVar10;
            if (psVar2 != (sel_t *)0x0) {
              uVar8 = (ulong)psVar2[uVar10];
            }
            lVar4 = *(long *)((long)ldata + (uVar11 - 8));
            lVar5 = *(long *)((long)&ldata->lower + uVar11);
            lVar6 = *(long *)((long)rdata + (uVar11 - 8));
            lVar7 = *(long *)((long)&rdata->lower + uVar11);
            psVar3[lVar12] = (sel_t)uVar8;
            lVar12 = lVar12 + (ulong)(lVar5 != lVar7 || lVar4 != lVar6);
            uVar10 = uVar10 + 1;
            uVar11 = uVar11 + 0x10;
            uVar8 = uVar10;
          } while (uVar15 != uVar10);
        }
      }
      else if (uVar16 == 0) {
        uVar8 = uVar15;
        if (uVar10 < uVar15) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar9 = (sel_t)uVar10;
            if (psVar2 != (sel_t *)0x0) {
              sVar9 = psVar2[uVar10];
            }
            psVar3[lVar12] = sVar9;
            lVar12 = lVar12 + 1;
            uVar10 = uVar10 + 1;
          } while (uVar15 != uVar10);
        }
      }
      else if (uVar10 < uVar15) {
        psVar2 = sel->sel_vector;
        psVar3 = false_sel->sel_vector;
        uVar11 = uVar10 << 4 | 8;
        uVar8 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar9 = (int)uVar10 + (int)uVar8;
          }
          else {
            sVar9 = psVar2[uVar10 + uVar8];
          }
          if ((uVar16 >> (uVar8 & 0x3f) & 1) == 0) {
            uVar14 = 1;
          }
          else {
            uVar14 = (ulong)(*(long *)((long)&ldata->lower + uVar11) !=
                             *(long *)((long)&rdata->lower + uVar11) ||
                            *(long *)((long)ldata + (uVar11 - 8)) !=
                            *(long *)((long)rdata + (uVar11 - 8)));
          }
          psVar3[lVar12] = sVar9;
          lVar12 = lVar12 + uVar14;
          uVar8 = uVar8 + 1;
          uVar11 = uVar11 + 0x10;
        } while ((uVar10 - uVar15) + uVar8 != 0);
        uVar8 = uVar10 + uVar8;
      }
      uVar13 = uVar13 + 1;
      uVar10 = uVar8;
    } while (uVar13 != count + 0x3f >> 6);
  }
  return count - lVar12;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}